

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

void __thiscall
llama_kv_cache_unified::seq_div
          (llama_kv_cache_unified *this,llama_seq_id seq_id,llama_pos p0,llama_pos p1,int d)

{
  bool bVar1;
  reference pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  llama_pos p_old;
  uint32_t i;
  llama_kv_cell *cell;
  int32_t tail_id;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  llama_kv_cell *in_stack_ffffffffffffffc0;
  uint local_2c;
  int local_14;
  int local_10;
  
  if (in_R8D != 1) {
    local_10 = in_EDX;
    if (in_EDX < 0) {
      local_10 = 0;
    }
    local_14 = in_ECX;
    if (in_ECX < 0) {
      local_14 = std::numeric_limits<int>::max();
    }
    if (local_10 != local_14) {
      if ((*(byte *)(in_RDI + 0x62) & 1) == 0) {
        for (local_2c = 0; local_2c < *(uint *)(in_RDI + 0x6c); local_2c = local_2c + 1) {
          std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                    ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x78),
                     (ulong)local_2c);
          bVar1 = llama_kv_cell::has_seq_id
                            (in_stack_ffffffffffffffc0,
                             (llama_seq_id *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (((bVar1) &&
              (pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                  ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                   (in_RDI + 0x78),(ulong)local_2c), local_10 <= pvVar2->pos)) &&
             (pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                 ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                  (in_RDI + 0x78),(ulong)local_2c), pvVar2->pos < local_14)) {
            *(undefined1 *)(in_RDI + 0x60) = 1;
            pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                               ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                (in_RDI + 0x78),(ulong)local_2c);
            in_stack_ffffffffffffffbc = pvVar2->pos;
            pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                               ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                (in_RDI + 0x78),(ulong)local_2c);
            pvVar2->pos = pvVar2->pos / in_R8D;
            pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                               ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                (in_RDI + 0x78),(ulong)local_2c);
            in_stack_ffffffffffffffbc = pvVar2->pos - in_stack_ffffffffffffffbc;
            pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                               ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                (in_RDI + 0x78),(ulong)local_2c);
            pvVar2->delta = in_stack_ffffffffffffffbc + pvVar2->delta;
          }
        }
      }
      else if ((-1 < in_ESI) && ((long)in_ESI < (long)(ulong)*(uint *)(in_RDI + 0x6c))) {
        pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                           ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x78)
                            ,(long)in_ESI);
        if (-1 < pvVar2->tail) {
          pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                             ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                              (in_RDI + 0x78),(long)pvVar2->tail);
          bVar1 = llama_kv_cell::has_seq_id
                            (in_stack_ffffffffffffffc0,
                             (llama_seq_id *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (((bVar1) && (local_10 <= pvVar2->pos)) && (pvVar2->pos < local_14)) {
            pvVar2->pos = pvVar2->pos / in_R8D;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llama_kv_cache_unified::seq_div(llama_seq_id seq_id, llama_pos p0, llama_pos p1, int d) {
    if (d == 1) {
        return;
    }

    if (p0 < 0) {
        p0 = 0;
    }

    if (p1 < 0) {
        p1 = std::numeric_limits<llama_pos>::max();
    }

    // If there is no range then return early to avoid looping over the cache.
    if (p0 == p1) {
        return;
    }

    if (recurrent) {
        // for Mamba-like or RWKV models, only the pos needs to be changed
        if (0 <= seq_id && seq_id < (int64_t) size) {
            const int32_t tail_id = cells[seq_id].tail;
            if (tail_id >= 0) {
                llama_kv_cell & cell = cells[tail_id];
                if (cell.has_seq_id(seq_id) && p0 <= cell.pos && cell.pos < p1) {
                    cell.pos /= d;
                }
            }
        }

        return;
    }

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id) && cells[i].pos >= p0 && cells[i].pos < p1) {
            has_shift = true;

            {
                llama_pos p_old = cells[i].pos;
                cells[i].pos   /= d;
                cells[i].delta += cells[i].pos - p_old;
            }
        }
    }
}